

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_node_case(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  LY_ERR LVar1;
  lysp_node *plVar2;
  
  if ((pnode->nodetype & 0xc002) == 0) {
    if (pnode->nodetype == 0x80) {
      plVar2 = pnode + 1;
      do {
        plVar2 = plVar2->parent;
        if (plVar2 == (lysp_node *)0x0) goto LAB_00148f5d;
        LVar1 = lys_compile_node(ctx,plVar2,node,0,(ly_set *)0x0);
        plVar2 = (lysp_node *)&plVar2->next;
      } while (LVar1 == LY_SUCCESS);
    }
    else {
      LVar1 = LY_EINT;
      ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
             ,0xecb);
    }
    return LVar1;
  }
LAB_00148f5d:
  LVar1 = lys_compile_node_augments(ctx,node);
  return LVar1;
}

Assistant:

static LY_ERR
lys_compile_node_case(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p;
    struct lysp_node_case *cs_p = (struct lysp_node_case *)pnode;

    if (pnode->nodetype & (LYS_CHOICE | LYS_AUGMENT | LYS_GROUPING)) {
        /* we have to add an implicit case node into the parent choice */
    } else if (pnode->nodetype == LYS_CASE) {
        /* explicit parent case */
        LY_LIST_FOR(cs_p->child, child_p) {
            LY_CHECK_GOTO(ret = lys_compile_node(ctx, child_p, node, 0, NULL), done);
        }
    } else {
        LOGINT_RET(ctx->ctx);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

done:
    return ret;
}